

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O3

Amount cfd::core::operator*(Amount *amount,int64_t value)

{
  long lVar1;
  Amount AVar2;
  
  lVar1 = amount->amount_;
  Amount::CheckValidAmount(0x337c18);
  Amount::CheckValidAmount(0x337c20);
  Amount::CheckValidAmount(0x337c2c);
  AVar2._8_8_ = 0;
  AVar2.amount_ = value * lVar1;
  return AVar2;
}

Assistant:

Amount operator*(const Amount& amount, const int64_t value) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) *= value;
}